

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

string * __thiscall
testing::internal::MatchMatrix::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,MatchMatrix *this)

{
  size_t j;
  ulong uVar1;
  char *pcVar2;
  size_t i;
  ulong uVar3;
  stringstream ss;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  pcVar2 = "";
  for (uVar3 = 0; uVar3 < *(ulong *)this; uVar3 = uVar3 + 1) {
    std::operator<<(local_1a8,pcVar2);
    for (uVar1 = 0; uVar1 < *(ulong *)(this + 8); uVar1 = uVar1 + 1) {
      std::ostream::_M_insert<bool>(SUB81(local_1a8,0));
    }
    pcVar2 = ";";
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  return __return_storage_ptr__;
}

Assistant:

string MatchMatrix::DebugString() const {
  ::std::stringstream ss;
  const char *sep = "";
  for (size_t i = 0; i < LhsSize(); ++i) {
    ss << sep;
    for (size_t j = 0; j < RhsSize(); ++j) {
      ss << HasEdge(i, j);
    }
    sep = ";";
  }
  return ss.str();
}